

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrUtil.c
# Opt level: O3

void Rwr_ManWriteToFile(Rwr_Man_t *p,char *pFileName)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  void *pvVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  void *__ptr;
  FILE *__s;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int level;
  int nEntries;
  timespec ts;
  uint local_44;
  timespec local_40;
  
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  pVVar1 = p->vForest;
  lVar9 = (long)pVVar1->nSize;
  local_44 = (uint)(lVar9 - 5U);
  __ptr = malloc(lVar9 * 8 - 0x28);
  if (5 < lVar9) {
    ppvVar2 = pVVar1->pArray;
    uVar8 = 0;
    do {
      pvVar3 = ppvVar2[uVar8 + 5];
      uVar4 = *(ulong *)((long)pvVar3 + 0x18);
      iVar6 = *(int *)(uVar4 & 0xfffffffffffffffe);
      *(uint *)((long)__ptr + uVar8 * 8 + 4) =
           ((uint)*(ulong *)((long)pvVar3 + 0x20) & 1) +
           *(int *)(*(ulong *)((long)pvVar3 + 0x20) & 0xfffffffffffffffe) * 2;
      *(uint *)((long)__ptr + uVar8 * 8) =
           *(uint *)((long)pvVar3 + 0xe) >> 0x1f | (((uint)uVar4 & 1) + iVar6 * 2) * 2;
      uVar8 = uVar8 + 1;
    } while ((lVar9 - 5U & 0xffffffff) != uVar8);
  }
  __s = fopen(pFileName,"wb");
  fwrite(&local_44,4,1,__s);
  uVar5 = local_44;
  fwrite(__ptr,4,(long)(int)local_44 * 2,__s);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  fclose(__s);
  iVar6 = 0x9a3221;
  printf("The number of nodes saved = %d.   ",(ulong)uVar5);
  Abc_Print(iVar6,"%s =","Saving");
  level = 3;
  iVar6 = clock_gettime(3,&local_40);
  if (iVar6 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar9 + lVar7) / 1000000.0);
  return;
}

Assistant:

void Rwr_ManWriteToFile( Rwr_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Rwr_Node_t * pNode;
    unsigned * pBuffer;
    int i, nEntries;
    abctime clk = Abc_Clock();
    // prepare the buffer
    nEntries = p->vForest->nSize - 5;
    pBuffer = ABC_ALLOC( unsigned, nEntries * 2 );
    for ( i = 0; i < nEntries; i++ )
    {
        pNode = (Rwr_Node_t *)p->vForest->pArray[i+5];
        pBuffer[2*i + 0] = (Rwr_Regular(pNode->p0)->Id << 1) | Rwr_IsComplement(pNode->p0);
        pBuffer[2*i + 1] = (Rwr_Regular(pNode->p1)->Id << 1) | Rwr_IsComplement(pNode->p1);
        // save EXOR flag
        pBuffer[2*i + 0] = (pBuffer[2*i + 0] << 1) | pNode->fExor;

    }
    pFile = fopen( pFileName, "wb" );
    fwrite( &nEntries, sizeof(int), 1, pFile );
    fwrite( pBuffer, sizeof(unsigned), nEntries * 2, pFile );
    ABC_FREE( pBuffer );
    fclose( pFile );
    printf( "The number of nodes saved = %d.   ", nEntries );  ABC_PRT( "Saving", Abc_Clock() - clk );
}